

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeIdentifier
          (ParserImpl *this,string *identifier)

{
  bool bVar1;
  Token *pTVar2;
  string *in_RSI;
  ParserImpl *in_RDI;
  Tokenizer *in_stack_00000078;
  undefined8 in_stack_ffffffffffffffa8;
  TokenType token_type;
  string *in_stack_ffffffffffffffb8;
  ParserImpl *in_stack_ffffffffffffffc0;
  string local_38 [32];
  string *local_18;
  ParserImpl *__rhs;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  token_type = (TokenType)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_18 = in_RSI;
  __rhs = in_RDI;
  bVar1 = LookingAtType(in_RDI,token_type);
  if (bVar1) {
    pTVar2 = io::Tokenizer::current(&in_RDI->tokenizer_);
    std::__cxx11::string::operator=(local_18,(string *)&pTVar2->text);
    io::Tokenizer::Next(in_stack_00000078);
    bVar1 = true;
  }
  else if (((((in_RDI->allow_field_number_ & 1U) == 0) && ((in_RDI->allow_unknown_field_ & 1U) == 0)
            ) && ((in_RDI->allow_unknown_extension_ & 1U) == 0)) ||
          (bVar1 = LookingAtType(in_RDI,token_type), !bVar1)) {
    io::Tokenizer::current(&in_RDI->tokenizer_);
    std::operator+((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    ReportError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string(local_38);
    bVar1 = false;
  }
  else {
    pTVar2 = io::Tokenizer::current(&in_RDI->tokenizer_);
    std::__cxx11::string::operator=(local_18,(string *)&pTVar2->text);
    io::Tokenizer::Next(in_stack_00000078);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool ConsumeIdentifier(std::string* identifier) {
    if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    // If allow_field_numer_ or allow_unknown_field_ is true, we should able
    // to parse integer identifiers.
    if ((allow_field_number_ || allow_unknown_field_ ||
         allow_unknown_extension_) &&
        LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      *identifier = tokenizer_.current().text;
      tokenizer_.Next();
      return true;
    }

    ReportError("Expected identifier, got: " + tokenizer_.current().text);
    return false;
  }